

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate.cc
# Opt level: O1

Validity __thiscall bssl::Certificate::GetValidity(Certificate *this)

{
  Validity validity;
  Validity local_18;
  
  bssl::der::GeneralizedTimeToPosixTime
            ((GeneralizedTime *)
             (*(long *)&((this->internals_)._M_t.
                         super___uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>
                         .super__Head_base<0UL,_bssl::CertificateInternals_*,_false>._M_head_impl)->
                        cert + 0x88),&local_18.not_before);
  bssl::der::GeneralizedTimeToPosixTime
            ((GeneralizedTime *)
             (*(long *)&((this->internals_)._M_t.
                         super___uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>
                         .super__Head_base<0UL,_bssl::CertificateInternals_*,_false>._M_head_impl)->
                        cert + 0x90),&local_18.not_after);
  return local_18;
}

Assistant:

Certificate::Validity Certificate::GetValidity() const {
  Certificate::Validity validity;

  // As this is a previously parsed certificate, we know the not_before
  // and not after are valid, so these conversions can not fail.
  (void) GeneralizedTimeToPosixTime(
      internals_->cert->tbs().validity_not_before, &validity.not_before);
  (void) GeneralizedTimeToPosixTime(
      internals_->cert->tbs().validity_not_after, &validity.not_after);
  return validity;
}